

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O3

void * lzham::task_pool::thread_func(void *pContext)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  code *pcVar7;
  undefined8 uVar8;
  
  iVar2 = sem_wait((sem_t *)((long)pContext + 0xa18));
  if (iVar2 == 0) {
    uVar1 = 0;
    uVar6 = 0;
    pcVar7 = (code *)0x0;
    uVar8 = 0;
    do {
      if (*(long *)((long)pContext + 0xa48) != 0) {
        return (void *)0x0;
      }
      iVar2 = pthread_spin_lock((pthread_spinlock_t *)pContext);
      if (iVar2 != 0) {
        lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                   ,0xf4);
      }
      iVar2 = *(int *)((long)pContext + 0x808);
      if (0 < iVar2) {
        *(uint *)((long)pContext + 0x808) = iVar2 - 1U;
        lVar4 = (ulong)(iVar2 - 1U) * 0x20;
        uVar6 = *(undefined8 *)((long)pContext + lVar4 + 8);
        uVar8 = *(undefined8 *)((long)pContext + lVar4 + 0x10);
        pcVar7 = *(code **)((long)pContext + lVar4 + 0x18);
        uVar1 = *(uint *)((long)pContext + lVar4 + 0x20);
      }
      iVar3 = pthread_spin_unlock((pthread_spinlock_t *)pContext);
      if (iVar3 != 0) {
        lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                   ,0xfc);
      }
      if (0 < iVar2) {
        if ((uVar1 & 1) == 0) {
          (*pcVar7)(uVar6,uVar8);
        }
        else {
          (*(code *)**(undefined8 **)pcVar7)(pcVar7,uVar6,uVar8);
        }
        LOCK();
        *(long *)((long)pContext + 0xa40) = *(long *)((long)pContext + 0xa40) + -1;
        UNLOCK();
      }
      iVar2 = sem_wait((sem_t *)((long)pContext + 0xa18));
    } while (iVar2 == 0);
  }
  piVar5 = __errno_location();
  if (*piVar5 != 0x6e) {
    lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
               ,0xb6);
  }
  return (void *)0x0;
}

Assistant:

void * task_pool::thread_func(void *pContext)
   {
      task_pool* pPool = static_cast<task_pool*>(pContext);
      task tsk;

      for ( ; ; )
      {
         if (!pPool->m_tasks_available.wait())
            break;

         if (pPool->m_exit_flag)
            break;

         if (pPool->m_task_stack.pop(tsk))
         {
            pPool->process_task(tsk);
         }
      }

      return NULL;
   }